

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XSValueTest.cpp
# Opt level: O3

void test_dt_gMonth(void)

{
  char cVar1;
  bool bVar2;
  XSValue_Data *pXVar3;
  XSValue *pXVar4;
  long lVar5;
  void *pvVar6;
  char *pcVar7;
  char *pcVar8;
  bool bVar9;
  int iVar10;
  Status myStatus;
  char iv_1 [6];
  char v_3 [5];
  char iv_3 [7];
  char iv_2 [9];
  char v_2 [11];
  char v_1 [18];
  Status local_114;
  StrX local_110;
  char local_100 [8];
  char local_f8 [8];
  char local_f0 [8];
  char local_e8 [16];
  char local_d8 [16];
  char local_c8 [32];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  builtin_strncpy(local_c8,"   --02+10:10   \n",0x12);
  builtin_strncpy(local_d8,"--10-12:12",0xb);
  builtin_strncpy(local_f8,"--12",5);
  builtin_strncpy(local_100,"--+11",6);
  builtin_strncpy(local_e8,"---02.09",9);
  builtin_strncpy(local_f0,"--14--",7);
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1183,local_c8,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1184,local_d8,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1185,local_f8,local_110.fLocalForm,1);
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    if (local_114 != st_FOCA0002) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      if ((ulong)local_114 < 0xb) {
        pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
      }
      else {
        pcVar7 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1188,local_100,local_110.fLocalForm,"st_FOCA0002",pcVar7);
      goto LAB_00128890;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1188,local_100,local_110.fLocalForm,0);
LAB_00128890:
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    if (local_114 != st_FOCA0002) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      if ((ulong)local_114 < 0xb) {
        pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
      }
      else {
        pcVar7 = "st_UnknownType";
      }
      printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
             ,0x1189,local_e8,local_110.fLocalForm,"st_FOCA0002",pcVar7);
      goto LAB_00128996;
    }
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x1189,local_e8,local_110.fLocalForm,0);
LAB_00128996:
    StrX::~StrX(&local_110);
    errSeen = 1;
  }
  local_114 = st_Init;
  local_110.fLocalForm =
       (char *)xercesc_4_0::XMLString::replicate
                         (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  local_110.fUnicodeForm =
       (XMLCh *)xercesc_4_0::XMLString::transcode
                          (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  cVar1 = xercesc_4_0::XSValue::validate
                    (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,
                     xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
  StrX::~StrX(&local_110);
  if (cVar1 == '\0') {
    if (local_114 == st_FOCA0002) goto LAB_00128a9f;
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    if ((ulong)local_114 < 0xb) {
      pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
    }
    else {
      pcVar7 = "st_UnknownType";
    }
    printf("VALIDATE_TEST Context Diff,                                                        at line <%d>, data=<%s> datatype=<%s>,                                               expStatus=<%s>, actStatus=<%s>\n"
           ,0x118a,local_f0,local_110.fLocalForm,"st_FOCA0002",pcVar7);
  }
  else {
    StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
    printf("VALIDATE_TEST Validation Fail:                                                       at line <%d>, data=<%s>, datatype=<%s>, expRetVal=<%d>\n"
           ,0x118a,local_f0,local_110.fLocalForm,0);
  }
  StrX::~StrX(&local_110);
  errSeen = 1;
LAB_00128a9f:
  bVar9 = true;
  do {
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar6 = (void *)0xd;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11a4,local_c8);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      uStack_50 = 0x200000000;
      local_48 = 0;
      uStack_40 = 0;
      local_38 = 0;
      bVar2 = compareActualValue(dt_gMonth,*pXVar3,
                                 (XSValue_Data)ZEXT1640(CONCAT88(0x200000000,local_58)));
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar6);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar6 = (void *)0xd;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11a5,local_d8);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      uStack_78 = 0xa00000000;
      local_70 = 0;
      uStack_68 = 0;
      local_60 = 0;
      bVar2 = compareActualValue(dt_gMonth,*pXVar3,
                                 (XSValue_Data)ZEXT1640(CONCAT88(0xa00000000,local_80)));
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar6);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pvVar6 = (void *)0xd;
    pXVar3 = (XSValue_Data *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar3 == (XSValue_Data *)0x0) {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("ACTVALUE_TEST No XSValue returned,                                                     at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11a6,local_f8);
      StrX::~StrX(&local_110);
      errSeen = 1;
    }
    else {
      uStack_a0 = 0xc00000000;
      local_98 = 0;
      uStack_90 = 0;
      local_88 = 0;
      bVar2 = compareActualValue(dt_gMonth,*pXVar3,
                                 (XSValue_Data)ZEXT1640(CONCAT88(0xc00000000,local_a8)));
      if (!bVar2) {
        errSeen = 1;
      }
      xercesc_4_0::XSValue::~XSValue((XSValue *)pXVar3);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar3,pvVar6);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_114 != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x11a9,local_100,local_110.fLocalForm,"st_FOCA0002",pcVar7);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pvVar6 = (void *)0x11a9;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11a9,local_100);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar6);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_114 != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x11aa,local_e8,local_110.fLocalForm,"st_FOCA0002",pcVar7);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pvVar6 = (void *)0x11aa;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11aa,local_e8);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar6);
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    pXVar4 = (XSValue *)
             xercesc_4_0::XSValue::getActualValue
                       (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                        xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (pXVar4 == (XSValue *)0x0) {
      if (local_114 != st_FOCA0002) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
        }
        printf("ACTVALUE_TEST Context Diff,                                                            at line <%d> data=<%s>, datatype=<%s>,                                                 expStatus=<%s>, actStatus=<%s>\n"
               ,0x11ab,local_f0,local_110.fLocalForm,"st_FOCA0002",pcVar7);
        StrX::~StrX(&local_110);
        errSeen = 1;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      pvVar6 = (void *)0x11ab;
      printf("ACTVALUE_TEST XSValue returned,                                                        at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11ab,local_f0);
      StrX::~StrX(&local_110);
      errSeen = 1;
      xercesc_4_0::XSValue::~XSValue(pXVar4);
      xercesc_4_0::XMemory::operator_delete((XMemory *)pXVar4,pvVar6);
    }
    bVar2 = bVar9 != false;
    bVar9 = false;
  } while (bVar2);
  iVar10 = 1;
  do {
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_c8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    bVar9 = SUB41(iVar10,0);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (local_114 != st_NoCanRep) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x11c7,local_c8,local_110.fLocalForm,"st_NoCanRep",pcVar7);
        StrX::~StrX(&local_110);
        goto LAB_00129281;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11c7,local_c8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_00129281:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_d8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (local_114 != st_NoCanRep) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x11c8,local_d8,local_110.fLocalForm,"st_NoCanRep",pcVar7);
        StrX::~StrX(&local_110);
        goto LAB_0012938a;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11c8,local_d8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_0012938a:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (local_114 != st_NoCanRep) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar7 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar7 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x11c9,local_f8,local_110.fLocalForm,"st_NoCanRep",pcVar7);
        StrX::~StrX(&local_110);
        goto LAB_0012948a;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11c9,local_f8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_0012948a:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_100,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (iVar10 * 4 + st_NoCanRep != local_114) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar7 = "st_NoCanRep";
        if (bVar9 != false) {
          pcVar7 = "st_FOCA0002";
        }
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x11cd,local_100,local_110.fLocalForm,pcVar7,pcVar8);
        StrX::~StrX(&local_110);
        goto LAB_0012959f;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11cd,local_100);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_0012959f:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_e8,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (iVar10 * 4 + st_NoCanRep != local_114) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar7 = "st_NoCanRep";
        if (bVar9 != false) {
          pcVar7 = "st_FOCA0002";
        }
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x11cf,local_e8,local_110.fLocalForm,pcVar7,pcVar8);
        StrX::~StrX(&local_110);
        goto LAB_001296bd;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11cf,local_e8);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_001296bd:
      errSeen = 1;
    }
    local_114 = st_Init;
    local_110.fLocalForm =
         (char *)xercesc_4_0::XMLString::replicate
                           (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    local_110.fUnicodeForm =
         (XMLCh *)xercesc_4_0::XMLString::transcode
                            (local_f0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    lVar5 = xercesc_4_0::XSValue::getCanonicalRepresentation
                      (local_110.fUnicodeForm,dt_gMonth,&local_114,ver_10,bVar9,
                       xercesc_4_0::XMLPlatformUtils::fgMemoryManager);
    StrX::~StrX(&local_110);
    if (lVar5 == 0) {
      if (iVar10 * 4 + st_NoCanRep != local_114) {
        StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
        pcVar7 = "st_NoCanRep";
        if (bVar9 != false) {
          pcVar7 = "st_FOCA0002";
        }
        pcVar8 = "st_UnknownType";
        if ((ulong)local_114 < 0xb) {
          pcVar8 = (&PTR_anon_var_dwarf_11d7_00140bc8)[local_114];
        }
        printf("CANREP_TEST Context Diff,                                                             at line <%d> data=<%s>, datatype=<%s>\n                                               expStatus=<%s>, actStatus=<%s>\n"
               ,0x11d1,local_f0,local_110.fLocalForm,pcVar7,pcVar8);
        StrX::~StrX(&local_110);
        goto LAB_001297d2;
      }
    }
    else {
      StrX::StrX(&local_110,(XMLCh *)&xercesc_4_0::SchemaSymbols::fgDT_MONTH);
      printf("CANREP_TEST CanRep returned:                                                          at line <%d> data=<%s>, datatype=<%s>\n"
             ,0x11d1,local_f0);
      StrX::~StrX(&local_110);
      (**(code **)(*(long *)xercesc_4_0::XMLPlatformUtils::fgMemoryManager + 0x20))
                (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,lVar5);
LAB_001297d2:
      errSeen = 1;
    }
    iVar10 = 0;
    if (bVar9 == false) {
      return;
    }
  } while( true );
}

Assistant:

void test_dt_gMonth()
{
    const XSValue::DataType dt = XSValue::dt_gMonth;
    bool  toValidate = true;

    const char v_1[]="   --02+10:10   \n";
    const char v_2[]="--10-12:12";
    const char v_3[]="--12";

    const char iv_1[]="--+11";
    const char iv_2[]="---02.09";
    const char iv_3[]="--14--";

    XSValue::XSValue_Data act_v_ran_v_1;
    XSValue::XSValue_Data act_v_ran_v_2;
    XSValue::XSValue_Data act_v_ran_v_3;

    act_v_ran_v_1.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_month   = 2;
    act_v_ran_v_1.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_1.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_1.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_1.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_2.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_month   = 10;
    act_v_ran_v_2.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_2.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_2.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_2.fValue.f_datetime.f_milisec = 0;

    act_v_ran_v_3.fValue.f_datetime.f_year    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_month   = 12;
    act_v_ran_v_3.fValue.f_datetime.f_day     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_hour    = 0;
    act_v_ran_v_3.fValue.f_datetime.f_min     = 0;
    act_v_ran_v_3.fValue.f_datetime.f_second  = 0;
    act_v_ran_v_3.fValue.f_datetime.f_milisec = 0;

    /***
     *
     * validate
     * ---------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *     valid                                       true              n/a
     *     invalid                                     false             st_FOCA0002
     *
     ***/

    //  valid
    VALIDATE_TEST(v_1,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_2,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);
    VALIDATE_TEST(v_3,  dt, EXP_RET_VALID_TRUE,  DONT_CARE);

    //  invalid
    VALIDATE_TEST(iv_1, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_2, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);
    VALIDATE_TEST(iv_3, dt, EXP_RET_VALID_FALSE, XSValue::st_FOCA0002);

    /***
     *
     * getActualValue
     * ---------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *  validation on
     *  =============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XSValue         n/a
     *   invalid                                           0            st_FOCA0002
     *
     ***/

    for (int i = 0; i < 2; i++)
    {
        //validation on/off
        toValidate = ( 0 == i) ? true : false;

        //  valid
        ACTVALUE_TEST(v_1,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_1);
        ACTVALUE_TEST(v_2,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_2);
        ACTVALUE_TEST(v_3,  dt, toValidate, EXP_RET_VALUE_TRUE,  DONT_CARE, act_v_ran_v_3);

        //  invalid
        ACTVALUE_TEST(iv_1, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_1);
        ACTVALUE_TEST(iv_2, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_2);
        ACTVALUE_TEST(iv_3, dt, toValidate, EXP_RET_VALUE_FALSE, XSValue::st_FOCA0002, act_v_ran_v_3);
    }

    /***
     *
     * getCanonicalRepresentation
     * ---------------------------
     *                             availability        return value      context
     *                             ----------------------------------------------
     *
     *  validation on
     *  =============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_FOCA0002
     *
     *  validation off
     *  ==============
     *   valid                                          XMLCh            st_NoCanRep
     *   invalid                                          0              st_NoCanRep
     *
     ***/

    for (int j = 0; j < 2; j++)
    {
        //validation on/off
        toValidate = ( 0 == j) ? true : false;

        //  valid
        CANREP_TEST(v_1,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_2,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);
        CANREP_TEST(v_3,  dt, toValidate, EXP_RET_CANREP_FALSE, null_string, XSValue::st_NoCanRep);

        //  invalid
        CANREP_TEST(iv_1, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_2, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));
        CANREP_TEST(iv_3, dt, toValidate, EXP_RET_CANREP_FALSE, null_string,
            (toValidate? XSValue::st_FOCA0002: XSValue::st_NoCanRep));

    }

}